

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

u32 jsonHexToInt4(char *z)

{
  return (uint)(((char)(z[3] * '\x02') >> 7 & 9U) + z[3] & 0xf) |
         (uint)(byte)((((char)(z[2] * '\x02') >> 7 & 9U) + z[2]) * '\x10') |
         (uint)(((char)(z[1] * '\x02') >> 7 & 9U) + z[1] & 0xf) << 8 |
         (uint)(((char)(*z * '\x02') >> 7 & 9U) + *z & 0xf) << 0xc;
}

Assistant:

static u32 jsonHexToInt4(const char *z){
  u32 v;
  assert( sqlite3Isxdigit(z[0]) );
  assert( sqlite3Isxdigit(z[1]) );
  assert( sqlite3Isxdigit(z[2]) );
  assert( sqlite3Isxdigit(z[3]) );
  v = (jsonHexToInt(z[0])<<12)
    + (jsonHexToInt(z[1])<<8)
    + (jsonHexToInt(z[2])<<4)
    + jsonHexToInt(z[3]);
  return v;
}